

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.hpp
# Opt level: O2

void __thiscall
generator::tag_b_t<cfgfile::string_trait_t>::set_cfg
          (tag_b_t<cfgfile::string_trait_t> *this,b_t *cfg)

{
  tag_a_t<cfgfile::string_trait_t> *this_00;
  pointer cfg_00;
  ptr_to_tag_t p;
  allocator local_89;
  tag_b_t<cfgfile::string_trait_t> *local_88;
  tag_vector_of_tags_t<generator::tag_a_t<cfgfile::string_trait_t>,_cfgfile::string_trait_t>
  *local_80;
  pointer local_78;
  __shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2> local_60;
  string_t local_50;
  
  cfgfile::tag_scalar_t<int,_cfgfile::string_trait_t>::set_value
            (&this->super_tag_scalar_t<int,_cfgfile::string_trait_t>,&cfg->m_integer_field);
  local_78 = (cfg->m_a_vector).super__Vector_base<generator::a_t,_std::allocator<generator::a_t>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_80 = &this->m_a_vector;
  local_88 = this;
  for (cfg_00 = (cfg->m_a_vector).
                super__Vector_base<generator::a_t,_std::allocator<generator::a_t>_>._M_impl.
                super__Vector_impl_data._M_start; cfg_00 != local_78; cfg_00 = cfg_00 + 1) {
    this_00 = (tag_a_t<cfgfile::string_trait_t> *)operator_new(0xe8);
    std::__cxx11::string::string((string *)&local_50,"a_vector",&local_89);
    tag_a_t<cfgfile::string_trait_t>::tag_a_t(this_00,&local_50,false);
    std::__shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>,void>
              ((__shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>,(__gnu_cxx::_Lock_policy)2>
                *)&local_70,this_00);
    std::__cxx11::string::~string((string *)&local_50);
    tag_a_t<cfgfile::string_trait_t>::set_cfg(local_70._M_ptr,cfg_00);
    std::__shared_ptr<generator::tag_a_t<cfgfile::string_trait_t>,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_60,&local_70);
    cfgfile::
    tag_vector_of_tags_t<generator::tag_a_t<cfgfile::string_trait_t>,_cfgfile::string_trait_t>::
    set_value(local_80,(ptr_to_tag_t *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  }
  (local_88->super_tag_scalar_t<int,_cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
  m_is_defined = true;
  return;
}

Assistant:

void set_cfg( const b_t & cfg )
	{
		this->set_value( cfg.integer_field() );

		for( const generator::a_t & v : cfg.a_vector() )
		{
			typename cfgfile::tag_vector_of_tags_t< generator::tag_a_t< Trait >, Trait >::ptr_to_tag_t p(
				new generator::tag_a_t< Trait >( "a_vector", false ) );

			p->set_cfg( v );

			m_a_vector.set_value( p );
		}

		this->set_defined();
	}